

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateArenaDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  reference ppFVar5;
  FieldGenerator *pFVar6;
  OneofDescriptor *this_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_1;
  int j;
  OneofDescriptor *oneof;
  int i_1;
  FieldDescriptor *field;
  int i;
  bool need_registration;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  io::Printer::Print(printer,"void $classname$::ArenaDtor(void* object) {\n","classname",
                     &this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "$classname$* _this = reinterpret_cast< $classname$* >(object);\n(void)_this;\n"
                     ,"classname",&this->classname_);
  bVar1 = false;
  for (field._0_4_ = 0;
      sVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_), (ulong)(long)(int)field < sVar4;
      field._0_4_ = (int)field + 1) {
    ppFVar5 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](&this->optimized_order_,(long)(int)field);
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar5);
    uVar2 = (*pFVar6->_vptr_FieldGenerator[0x10])(pFVar6,printer);
    if ((uVar2 & 1) != 0) {
      bVar1 = true;
    }
  }
  for (oneof._4_4_ = 0; iVar3 = Descriptor::oneof_decl_count(this->descriptor_), oneof._4_4_ < iVar3
      ; oneof._4_4_ = oneof._4_4_ + 1) {
    this_00 = Descriptor::oneof_decl(this->descriptor_,oneof._4_4_);
    for (field_1._4_4_ = 0; iVar3 = OneofDescriptor::field_count(this_00), field_1._4_4_ < iVar3;
        field_1._4_4_ = field_1._4_4_ + 1) {
      field_00 = OneofDescriptor::field(this_00,field_1._4_4_);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,field_00);
      uVar2 = (*pFVar6->_vptr_FieldGenerator[0x10])(pFVar6,printer);
      if ((uVar2 & 1) != 0) {
        bVar1 = true;
      }
    }
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"_this->_weak_field_map_.ClearAll();\n");
    bVar1 = true;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  if (bVar1) {
    io::Printer::Print(printer,
                       "inline void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n  if (arena != NULL) {\n    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n  }\n}\n"
                       ,"classname",&this->classname_);
  }
  else {
    io::Printer::Print(printer,
                       "void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n}\n"
                       ,"classname",&this->classname_);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateArenaDestructorCode(io::Printer* printer) {
  // Generate the ArenaDtor() method. Track whether any fields actually produced
  // code that needs to be called.
  printer->Print(
      "void $classname$::ArenaDtor(void* object) {\n",
      "classname", classname_);
  printer->Indent();

  // This code is placed inside a static method, rather than an ordinary one,
  // since that simplifies Arena's destructor list (ordinary function pointers
  // rather than member function pointers). _this is the object being
  // destructed.
  printer->Print(
      "$classname$* _this = reinterpret_cast< $classname$* >(object);\n"
      // avoid an "unused variable" warning in case no fields have dtor code.
      "(void)_this;\n",
      "classname", classname_);

  bool need_registration = false;
  // Process non-oneof fields first.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];
    if (field_generators_.get(field)
                         .GenerateArenaDestructorCode(printer)) {
      need_registration = true;
    }
  }

  // Process oneof fields.
  //
  // Note:  As of 10/5/2016, GenerateArenaDestructorCode does not emit anything
  // and returns false for oneof fields.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);

    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      if (field_generators_.get(field)
                           .GenerateArenaDestructorCode(printer)) {
        need_registration = true;
      }
    }
  }
  if (num_weak_fields_) {
    // _this is the object being destructed (we are inside a static method
    // here).
    printer->Print("_this->_weak_field_map_.ClearAll();\n");
    need_registration = true;
  }

  printer->Outdent();
  printer->Print(
      "}\n");

  if (need_registration) {
    printer->Print(
        "inline void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n"
        "  if (arena != NULL) {\n"
        "    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n"
        "  }\n"
        "}\n",
        "classname", classname_);
  } else {
    printer->Print(
        "void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n"
        "}\n",
        "classname", classname_);
  }
}